

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O1

MempoolAcceptResult *
MempoolAcceptResult::Failure(MempoolAcceptResult *__return_storage_ptr__,TxValidationState state)

{
  long lVar1;
  TxValidationState state_00;
  undefined8 *in_RSI;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 uVar2;
  undefined1 *puVar3;
  undefined8 in_stack_ffffffffffffffa0;
  long in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined1 *puVar4;
  undefined8 in_stack_ffffffffffffffc0;
  long in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = *in_RSI;
  puVar3 = &stack0xffffffffffffffa8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff98,in_RSI[1],in_RSI[2] + in_RSI[1]);
  puVar4 = &stack0xffffffffffffffc8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffffb8,in_RSI[5],in_RSI[6] + in_RSI[5]);
  state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)uVar2;
  state_00.super_ValidationState<TxValidationResult>.m_mode = (int)in_stack_ffffffffffffff88;
  state_00.super_ValidationState<TxValidationResult>.m_result =
       (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length =
       (size_type)puVar3;
  state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       in_stack_ffffffffffffffa0;
  state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
       in_stack_ffffffffffffffa8;
  state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)in_stack_ffffffffffffffb0;
  state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
       (size_type)puVar4;
  state_00.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_allocated_capacity =
       in_stack_ffffffffffffffc0;
  state_00.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
       in_stack_ffffffffffffffc8;
  MempoolAcceptResult(__return_storage_ptr__,state_00);
  if (puVar4 != &stack0xffffffffffffffc8) {
    operator_delete(puVar4,in_stack_ffffffffffffffc8 + 1);
  }
  if (puVar3 != &stack0xffffffffffffffa8) {
    operator_delete(puVar3,in_stack_ffffffffffffffa8 + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static MempoolAcceptResult Failure(TxValidationState state) {
        return MempoolAcceptResult(state);
    }